

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int emit_label(JSParseState *s,int label)

{
  int iVar1;
  uint32_t in_ESI;
  JSParseState *in_RDI;
  undefined4 unaff_retaddr;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((int)in_ESI < 0) {
    iVar1 = -1;
  }
  else {
    emit_op((JSParseState *)CONCAT44(label,unaff_retaddr),
            (uint8_t)((uint)in_stack_fffffffffffffffc >> 0x18));
    emit_u32(in_RDI,in_ESI);
    in_RDI->cur_func->label_slots[(int)in_ESI].pos = (int)(in_RDI->cur_func->byte_code).size;
    iVar1 = (int)(in_RDI->cur_func->byte_code).size + -4;
  }
  return iVar1;
}

Assistant:

static int emit_label(JSParseState *s, int label)
{
    if (label >= 0) {
        emit_op(s, OP_label);
        emit_u32(s, label);
        s->cur_func->label_slots[label].pos = s->cur_func->byte_code.size;
        return s->cur_func->byte_code.size - 4;
    } else {
        return -1;
    }
}